

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int aesecb_setup_crypto(ptls_cipher_context_t *_ctx,int is_enc,void *key,size_t key_size)

{
  int extraout_EAX;
  code *pcVar1;
  aesecb_context_t *ctx;
  
  _ctx->do_dispose = aesecb_dispose;
  _ctx->do_init = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)0x0;
  pcVar1 = aesecb_encrypt;
  if (is_enc == 0) {
    pcVar1 = aesecb_decrypt;
  }
  _ctx->do_transform = pcVar1;
  cf_aes_init((cf_aes_context *)(_ctx + 1),(uint8_t *)key,key_size);
  return extraout_EAX;
}

Assistant:

static int aesecb_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key, size_t key_size)
{
    struct aesecb_context_t *ctx = (struct aesecb_context_t *)_ctx;
    ctx->super.do_dispose = aesecb_dispose;
    ctx->super.do_init = NULL;
    ctx->super.do_transform = is_enc ? aesecb_encrypt : aesecb_decrypt;
    cf_aes_init(&ctx->aes, key, key_size);
    return 0;
}